

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateFunctionDefinition(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression)

{
  SynBase *source;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  TypeRef *type;
  ExprFunctionLiteral *this;
  ExprBase *context;
  ExprFunctionDefinition *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pEVar3 = &ExpressionContext::get<ExprNullptrLiteral>(ctx->ctx)->super_ExprBase;
    source = (expression->super_ExprBase).source;
    type = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    ExprNullptrLiteral::ExprNullptrLiteral
              ((ExprNullptrLiteral *)pEVar3,source,&type->super_TypeBase);
    this = ExpressionContext::get<ExprFunctionLiteral>(ctx->ctx);
    ExprFunctionLiteral::ExprFunctionLiteral
              (this,(expression->super_ExprBase).source,&expression->function->type->super_TypeBase,
               expression->function,pEVar3);
    ctx_local = (ExpressionEvalContext *)
                CheckType(&expression->super_ExprBase,&this->super_ExprBase);
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateFunctionDefinition(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

	return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->function->type, expression->function, context));
}